

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_query_result.cpp
# Opt level: O0

vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_true>
* __thiscall duckdb::ArrowQueryResult::Arrays(ArrowQueryResult *this)

{
  bool bVar1;
  undefined8 uVar2;
  string *psVar3;
  BaseQueryResult *in_RDI;
  string local_60 [55];
  allocator local_29;
  string local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  InvalidInputException *in_stack_fffffffffffffff0;
  
  bVar1 = BaseQueryResult::HasError(in_RDI);
  if (!bVar1) {
    return (vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_true>
            *)&in_RDI[1].properties.read_databases._M_h._M_rehash_policy._M_next_resize;
  }
  uVar2 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_28,
             "Attempting to fetch ArrowArrays from an unsuccessful query result\n: Error %s",
             &local_29);
  psVar3 = BaseQueryResult::GetError_abi_cxx11_((BaseQueryResult *)0x1526e4f);
  ::std::__cxx11::string::string(local_60,(string *)psVar3);
  InvalidInputException::InvalidInputException<std::__cxx11::string>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  __cxa_throw(uVar2,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
}

Assistant:

vector<unique_ptr<ArrowArrayWrapper>> &ArrowQueryResult::Arrays() {
	if (HasError()) {
		throw InvalidInputException("Attempting to fetch ArrowArrays from an unsuccessful query result\n: Error %s",
		                            GetError());
	}
	return arrays;
}